

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

int __thiscall FileEntryInfo::allocateEntity(FileEntryInfo *this,int sectorNum)

{
  int iVar1;
  ulong uVar2;
  
  this->m_sectorNum = sectorNum;
  if ((this->m_fileType == RealtimeFile) || (this->m_fileType == File)) {
    uVar2 = (long)(this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    if (uVar2 < 0x71) {
      iVar1 = 1;
    }
    else {
      iVar1 = ((int)uVar2 + 10) / 0x7c + 1;
    }
  }
  else {
    iVar1 = 2;
  }
  this->m_sectorsUsed = iVar1;
  return iVar1;
}

Assistant:

int FileEntryInfo::allocateEntity(const int sectorNum)
{
    m_sectorNum = sectorNum;
    if (!isFile())
        m_sectorsUsed = 2;  // restriction here: amount of files/subdirs is limited by sector size.
    else if (m_extents.size() <= MAX_EXTENTS_IN_EXTFILE)
        m_sectorsUsed = 1;
    else
    {
        const int sz = static_cast<int>(m_extents.size() - 1 - MAX_EXTENTS_IN_EXTFILE);
        m_sectorsUsed = 1 + (sz + MAX_EXTENTS_IN_EXTCONT - 1) / MAX_EXTENTS_IN_EXTCONT;
    }
    return m_sectorsUsed;
}